

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::
     class_<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>_>
     ::init_holder(instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  byte *pbVar1;
  void **ppvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  instance *piVar4;
  
  if (holder_ptr == (holder_type *)0x0) {
    if ((inst->field_0x30 & 1) == 0) {
      return;
    }
    ppvVar2 = v_h->vh;
    ppvVar2[1] = (Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *)*ppvVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ppvVar2 + 2),
               (Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *)*ppvVar2);
  }
  else {
    ppvVar2 = v_h->vh;
    ppvVar2[1] = (holder_ptr->
                 super___shared_ptr<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
    p_Var3 = (holder_ptr->
             super___shared_ptr<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    ppvVar2[2] = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
  }
  piVar4 = v_h->inst;
  if ((piVar4->field_0x30 & 2) == 0) {
    pbVar1 = (piVar4->field_1).nonsimple.status + v_h->index;
    *pbVar1 = *pbVar1 | 1;
  }
  else {
    piVar4->field_0x30 = piVar4->field_0x30 | 4;
  }
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type *holder_ptr, const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }